

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  const_iterator __position;
  element_type *peVar1;
  TestCase **ppTVar2;
  pointer pTVar3;
  size_type sVar4;
  undefined8 uVar5;
  shared_ptr<Catch::Config> *psVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar10;
  undefined4 extraout_var;
  long *plVar11;
  long lVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  size_type *psVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  _Base_ptr p_Var15;
  char *pcVar16;
  ostream *poVar17;
  const_iterator __begin3_1;
  long lVar18;
  pointer *__ptr;
  int iVar19;
  TestCase **__v;
  pointer pFVar20;
  undefined8 *puVar21;
  iterator __begin3;
  undefined1 auVar22 [8];
  pointer pTVar23;
  pointer pbVar24;
  pointer *__x;
  undefined1 auVar25 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  string filename;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_358;
  undefined8 *local_350;
  undefined1 local_348 [16];
  undefined1 local_338 [56];
  IStreamingReporterPtr local_300;
  undefined1 local_2f8 [24];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [24];
  undefined1 local_2b8 [24];
  shared_ptr<Catch::Config> *local_2a0;
  undefined1 local_298 [24];
  long local_280;
  undefined1 local_278 [240];
  long *local_188;
  ulong local_168;
  long *local_140;
  undefined1 local_78 [48];
  undefined1 auStack_48 [8];
  undefined1 local_40 [16];
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  config(this);
  seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_IConfig);
  local_2a0 = &this->m_config;
  if ((this->m_configData).filenamesAsTags == true) {
    peVar1 = (local_2a0->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar8 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar10);
    plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar8) + 0x18))
                                ((long *)CONCAT44(extraout_var,iVar8),peVar1);
    lVar18 = plVar11[1];
    if (*plVar11 != lVar18) {
      __x = (pointer *)(*plVar11 + 0x60);
      do {
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_348,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_278,
                   (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(__x + 6))->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,(allocator<char> *)&local_358)
        ;
        lVar12 = std::__cxx11::string::find_last_of((char *)local_278,0x1f4665,0xffffffffffffffff);
        if (lVar12 != -1) {
          std::__cxx11::string::erase((ulong)local_278,0);
          *(char *)local_278._0_8_ = '#';
        }
        p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  std::__cxx11::string::rfind
                            ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_278,0x2e);
        if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff) {
          if ((ulong)local_278._8_8_ < p_Var13) {
            auVar25 = std::__throw_out_of_range_fmt
                                ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                 "basic_string::erase",p_Var13);
            if ((element_type *)local_348._8_8_ != (element_type *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_);
            }
            if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
            }
            if (auVar25._8_4_ == 1) {
              plVar11 = (long *)__cxa_begin_catch(auVar25._0_8_);
              pcVar16 = (char *)(**(code **)(*plVar11 + 0x10))(plVar11);
              poVar17 = std::operator<<((ostream *)&std::cerr,pcVar16);
              std::endl<char,std::char_traits<char>>(poVar17);
              __cxa_end_catch();
              return 0xff;
            }
            _Unwind_Resume(auVar25._0_8_);
          }
          *(char *)(local_278._0_8_ + (long)p_Var13) = '\0';
          local_278._8_8_ = p_Var13;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2f8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_348);
        setTags((TestCaseInfo *)(__x + -0xc),
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2f8);
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        clara::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_348);
        lVar12 = (long)(__x + 0xb);
        __x = __x + 0x17;
      } while (lVar12 != lVar18);
    }
  }
  list((Catch *)local_278,local_2a0);
  if ((int *)local_278._0_8_ != (int *)0x0) {
    return *(int *)local_278._0_8_;
  }
  local_278._0_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_278._8_8_ =
       (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_2f8._0_4_ = (undefined4)local_278._0_8_;
  local_2f8._4_4_ = (undefined4)((ulong)local_278._0_8_ >> 0x20);
  if ((pointer)local_278._8_8_ == (pointer)0x0) {
    local_2f8._8_8_ = (pointer)0x0;
    goto LAB_0012cd5d;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&((pointer)local_278._8_8_)->_M_string_length =
         (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    UNLOCK();
    peVar1 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_2f8._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    local_2f8._0_4_ = SUB84(peVar1,0);
    local_2f8._4_4_ = (undefined4)((ulong)peVar1 >> 0x20);
    if ((pointer)local_2f8._8_8_ == (pointer)0x0) goto LAB_0012cd5d;
    psVar14 = &((pointer)local_2f8._8_8_)->_M_string_length;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)psVar14 = (int)*psVar14 + 1;
      UNLOCK();
      goto LAB_0012cd5d;
    }
  }
  else {
    *(int *)&((pointer)local_278._8_8_)->_M_string_length =
         (int)((pointer)local_278._8_8_)->_M_string_length + 1;
    psVar14 = &((pointer)local_278._8_8_)->_M_string_length;
    local_2f8._8_8_ = local_278._8_8_;
  }
  *(int *)psVar14 = (int)*psVar14 + 1;
LAB_0012cd5d:
  pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar8 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar10);
  plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar8) + 0x20))
                              ((long *)CONCAT44(extraout_var_00,iVar8));
  if (*plVar11 == plVar11[1]) {
    local_348._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_348._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_300,
               &(((element_type *)local_348._0_8_)->m_data).reporterName,(IConfigPtr *)local_348);
  }
  else {
    local_300._M_t.
    super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
    ._M_t.
    super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
    .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
         (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
          )operator_new(0x30);
    *(undefined ***)
     local_300._M_t.
     super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
     ._M_t.
     super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
     .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl =
         &PTR__ListeningReporter_0023de00;
    *(undefined1 (*) [16])
     ((long)local_300._M_t.
            super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 8) =
         (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)local_300._M_t.
            super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
            ._M_t.
            super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
            .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x18) =
         (undefined1  [16])0x0;
    *(undefined2 *)
     &((IStreamingReporter *)
      ((long)local_300._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl + 0x28))->
      _vptr_IStreamingReporter = 0x100;
    local_2b8._0_8_ =
         local_300._M_t.
         super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
         ._M_t.
         super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
         .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar8 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar10);
    plVar11 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x20))
                                ((long *)CONCAT44(extraout_var_01,iVar8));
    puVar21 = (undefined8 *)*plVar11;
    local_350 = (undefined8 *)plVar11[1];
    if (puVar21 != local_350) {
      local_338._48_8_ = local_2b8._0_8_ + 8;
      do {
        plVar11 = (long *)*puVar21;
        peVar1 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        pFVar20 = (pointer)(this->m_config).
                           super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                           ._M_pi;
        if (pFVar20 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar14 = &(pFVar20->name)._M_string_length;
            *(int *)psVar14 = (int)*psVar14 + 1;
            UNLOCK();
          }
          else {
            psVar14 = &(pFVar20->name)._M_string_length;
            *(int *)psVar14 = (int)*psVar14 + 1;
          }
        }
        iVar8 = (*(peVar1->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar1);
        local_348._0_8_ = CONCAT44(extraout_var_02,iVar8);
        if (pFVar20 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            psVar14 = &(pFVar20->name)._M_string_length;
            *(int *)psVar14 = (int)*psVar14 + 1;
            UNLOCK();
          }
          else {
            psVar14 = &(pFVar20->name)._M_string_length;
            *(int *)psVar14 = (int)*psVar14 + 1;
          }
        }
        local_348._8_8_ = peVar1;
        local_338._0_8_ = pFVar20;
        (**(code **)(*plVar11 + 0x10))(&local_358,plVar11,local_348);
        std::
        vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
        ::
        emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                  ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                    *)local_338._48_8_,
                   (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                    *)&local_358);
        if (local_358._M_head_impl != (IStreamingReporter *)0x0) {
          (*(local_358._M_head_impl)->_vptr_IStreamingReporter[1])();
        }
        local_358._M_head_impl = (IStreamingReporter *)0x0;
        if ((pointer)local_338._0_8_ != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._0_8_);
        }
        if (pFVar20 != (pointer)0x0) {
          clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pFVar20);
        }
        puVar21 = puVar21 + 2;
      } while (puVar21 != local_350);
    }
    local_348._0_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_348._8_8_ =
         (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    uVar5 = local_2b8._0_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_)->_M_use_count + 1;
      }
    }
    anon_unknown_1::createReporter
              ((anon_unknown_1 *)&local_358,
               &(((element_type *)local_348._0_8_)->m_data).reporterName,(IConfigPtr *)local_348);
    ListeningReporter::addReporter((ListeningReporter *)uVar5,(IStreamingReporterPtr *)&local_358);
    if (local_358._M_head_impl != (IStreamingReporter *)0x0) {
      (*(local_358._M_head_impl)->_vptr_IStreamingReporter[1])();
    }
    local_358._M_head_impl = (IStreamingReporter *)0x0;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_348._8_8_);
  }
  RunContext::RunContext((RunContext *)(local_278 + 0x10),(IConfigPtr *)local_2f8,&local_300);
  if (local_300._M_t.
      super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
      .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>)
      0x0) {
    (*(*(_func_int ***)
        local_300._M_t.
        super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
        ._M_t.
        super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
        .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)[1])();
  }
  if ((pointer)local_2f8._8_8_ != (pointer)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
  }
  uVar5 = local_278._0_8_;
  __position._M_node = (_Base_ptr)(local_78 + 8);
  local_78._8_4_ = 0;
  local_78._16_8_ = 0;
  stack0xffffffffffffffb0 = (undefined1  [16])0x0;
  local_40 = (undefined1  [16])0x0;
  local_78._24_8_ = __position._M_node;
  local_78._32_8_ = __position._M_node;
  pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar8 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar10);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar8) + 0x18))
                        ((long *)CONCAT44(extraout_var_03,iVar8),uVar5);
  iVar8 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  TestSpec::matchesByFilter
            ((Matches *)local_2f8,(TestSpec *)CONCAT44(extraout_var_04,iVar8),testCases,
             (IConfig *)local_278._0_8_);
  local_338._0_8_ = local_40._8_8_;
  sVar4 = CONCAT44(local_2f8._4_4_,local_2f8._0_4_);
  local_348._8_8_ = local_40._0_8_;
  local_40._8_8_ = local_2f8._16_8_;
  local_40._0_8_ = local_2f8._8_8_;
  local_348._0_8_ = auStack_48;
  local_2f8._0_4_ = 0;
  local_2f8._4_4_ = 0;
  local_2f8._8_8_ = (pointer)0x0;
  local_2f8._16_8_ = (pointer)0x0;
  auStack_48 = (undefined1  [8])sVar4;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_348);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          local_2f8);
  iVar8 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_350 = (undefined8 *)local_40._0_8_;
  if (auStack_48 == (undefined1  [8])local_40._0_8_) {
    if (*(long *)(CONCAT44(extraout_var_05,iVar8) + 0x18) ==
        *(long *)(CONCAT44(extraout_var_05,iVar8) + 0x20)) {
      pTVar23 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pTVar3 = (testCases->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar23 != pTVar3) {
        do {
          if (((pTVar23->super_TestCaseInfo).properties & IsHidden) == None) {
            local_348._0_8_ = pTVar23;
            std::
            _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
            ::_M_emplace_unique<Catch::TestCase_const*>
                      ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                        *)local_78,(TestCase **)local_348);
          }
          pTVar23 = pTVar23 + 1;
        } while (pTVar23 != pTVar3);
      }
    }
  }
  else {
    auVar22 = auStack_48;
    do {
      ppTVar2 = *(TestCase ***)((long)auVar22 + 0x28);
      local_348._0_8_ = (pointer)local_78;
      for (__v = *(TestCase ***)((long)auVar22 + 0x20); __v != ppTVar2; __v = __v + 1) {
        std::
        _Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
        ::
        _M_insert_unique_<Catch::TestCase_const*const&,std::_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>::_Alloc_node>
                  ((_Rb_tree<Catch::TestCase_const*,Catch::TestCase_const*,std::_Identity<Catch::TestCase_const*>,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                    *)local_78,__position,__v,(_Alloc_node *)local_348);
      }
      auVar22 = (undefined1  [8])((long)auVar22 + 0x38);
    } while (auVar22 != (undefined1  [8])local_350);
  }
  iVar8 = (**(code **)(*(long *)local_278._0_8_ + 0x68))();
  local_2f8._0_4_ = 0;
  local_2f8._8_8_ = (pointer)0x0;
  local_2f8._16_8_ = (pointer)0x0;
  local_2e0 = (undefined1  [16])0x0;
  local_2d0._0_16_ = (undefined1  [16])0x0;
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_348);
  RunContext::testGroupStarting((RunContext *)(local_278 + 0x10),(string *)local_348,1,1);
  if ((pointer)local_348._0_8_ != (pointer)local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338._0_8_ + 1));
  }
  pFVar20 = (pointer)0x0;
  local_280 = CONCAT44(extraout_var_06,iVar8);
  if ((_Base_ptr)local_78._24_8_ != __position._M_node) {
    local_2b8._0_16_ = (undefined1  [16])0x0;
    local_338._48_8_ =
         (vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
          *)0x0;
    local_350 = (undefined8 *)0x0;
    pFVar20 = (pointer)0x0;
    pbVar24 = (pointer)0x0;
    local_298._0_16_ = (undefined1  [16])0x0;
    p_Var15 = (_Base_ptr)local_78._24_8_;
    do {
      uVar7 = local_168;
      iVar8 = (**(code **)(*local_188 + 0x48))();
      if (uVar7 < (ulong)(long)iVar8) {
        RunContext::runTest((Totals *)local_348,(RunContext *)(local_278 + 0x10),
                            *(TestCase **)(p_Var15 + 1));
        pbVar24 = (pointer)((long)&(pbVar24->_M_dataplus)._M_p + local_348._8_8_);
        pFVar20 = (pointer)((long)&(pFVar20->name)._M_dataplus._M_p + local_338._0_8_);
        local_350 = (undefined8 *)((long)local_350 + local_338._8_8_);
        local_298._0_8_ = (long)&((_Alloc_hider *)local_2b8._0_8_)->_M_p + local_338._16_8_;
        local_298._8_8_ = (long)&((_Alloc_hider *)local_2b8._8_8_)->_M_p + local_338._24_8_;
        local_338._48_8_ = local_338._32_8_ + local_338._48_8_;
        local_2b8._8_8_ = local_298._8_8_;
        local_2b8._0_8_ = local_298._0_8_;
      }
      else {
        (**(code **)(*local_140 + 0x78))(local_140,*(undefined8 *)(p_Var15 + 1));
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != __position._M_node);
    local_2e0._8_8_ = local_298._0_8_;
    local_2e0._0_8_ = local_350;
    local_2d0._8_8_ = local_338._48_8_;
    local_2d0._0_8_ = local_298._8_8_;
    local_2f8._8_8_ = pbVar24;
    local_2f8._16_8_ = pFVar20;
  }
  iVar19 = 0;
  uVar5 = local_40._0_8_;
  iVar8 = local_2f8._0_4_;
  if (auStack_48 != (undefined1  [8])local_40._0_8_) {
    iVar19 = 0;
    auVar22 = auStack_48;
    do {
      if (*(long *)((long)auVar22 + 0x20) == *(long *)((long)auVar22 + 0x28)) {
        iVar19 = -1;
        (**(code **)(*local_140 + 0x18))(local_140,auVar22);
      }
      auVar22 = (undefined1  [8])((long)auVar22 + 0x38);
      iVar8 = iVar19;
    } while (auVar22 != (undefined1  [8])uVar5);
  }
  local_2f8._0_4_ = iVar8;
  lVar12 = *(long *)(local_280 + 0x20);
  for (lVar18 = *(long *)(local_280 + 0x18); lVar18 != lVar12; lVar18 = lVar18 + 0x20) {
    (**(code **)(*local_140 + 0x20))(local_140,lVar18);
  }
  (**(code **)(*(long *)local_278._0_8_ + 0x20))(local_348);
  RunContext::testGroupEnded
            ((RunContext *)(local_278 + 0x10),(string *)local_348,(Totals *)local_2f8,1,1);
  psVar6 = local_2a0;
  if ((pointer)local_348._0_8_ != (pointer)local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338._0_8_ + 1));
  }
  iVar9 = (*(((psVar6->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
  iVar8 = 2;
  if (((byte)iVar9 & iVar19 == -1) == 0) {
    iVar8 = (int)pFVar20;
    if ((int)pFVar20 < iVar19) {
      iVar8 = iVar19;
    }
    if (0xfe < iVar8) {
      iVar8 = 0xff;
    }
  }
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          auStack_48);
  clara::std::
  _Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::~_Rb_tree((_Rb_tree<const_Catch::TestCase_*,_const_Catch::TestCase_*,_std::_Identity<const_Catch::TestCase_*>,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
               *)local_78);
  RunContext::~RunContext((RunContext *)(local_278 + 0x10));
  if ((pointer)local_278._8_8_ != (pointer)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
  }
  return iVar8;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            TestGroup tests { m_config };
            auto const totals = tests.execute();

            if( m_config->warnAboutNoTests() && totals.error == -1 )
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }